

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::ConservativeScalMinMax
          (NavierStokesBase *this,MultiFab *Snew,int snew_comp,int new_density_comp,MultiFab *Sold,
          int sold_comp,int old_density_comp)

{
  long lVar1;
  double dVar2;
  EBFArrayBoxFactory *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int jj;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int kk;
  long lVar20;
  long lVar21;
  long lVar22;
  int ii;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long local_328;
  long local_320;
  long local_308;
  long local_300;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  Box local_1ec;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)Snew,true);
  lVar1 = -1;
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) {
      amrex::MFIter::~MFIter(&mfi);
      return;
    }
    amrex::MFIter::tilebox(&local_1ec,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&Snew->super_FabArray<amrex::FArrayBox>,&mfi,snew_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&Sold->super_FabArray<amrex::FArrayBox>,&mfi,sold_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_150,&Snew->super_FabArray<amrex::FArrayBox>,&mfi,new_density_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_190,&Sold->super_FabArray<amrex::FArrayBox>,&mfi,old_density_comp);
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (this_00 == (EBFArrayBoxFactory *)0x0) break;
    this_01 = &amrex::EBFArrayBoxFactory::getVolFrac(this_00)->super_FabArray<amrex::FArrayBox>;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_1d0,this_01,&mfi);
    lVar11 = (long)local_1ec.smallend.vect[1];
    lVar16 = (long)local_1ec.smallend.vect[2];
    lVar14 = local_190.jstride * 8;
    lVar15 = local_190.kstride * 8;
    lVar23 = (long)local_1ec.smallend.vect[0];
    local_320 = ((lVar16 - local_190.begin.z) + -1) * lVar15 +
                ((lVar11 - local_190.begin.y) + -1) * lVar14 + lVar23 * 8 +
                (long)local_190.begin.x * -8 + (long)local_190.p;
    lVar9 = local_110.jstride * 8;
    lVar13 = local_110.kstride * 8;
    local_300 = ((lVar16 - local_110.begin.z) + -1) * lVar13 +
                ((lVar11 - local_110.begin.y) + -1) * lVar9 + lVar23 * 8 +
                (long)local_110.begin.x * -8 + (long)local_110.p;
    lVar3 = local_1d0.jstride * 8;
    lVar21 = local_1d0.kstride * 8;
    local_308 = ((lVar16 - local_1d0.begin.z) + -1) * lVar21 +
                ((lVar11 - local_1d0.begin.y) + -1) * lVar3 + lVar23 * 8 +
                (long)local_1d0.begin.x * -8 + (long)local_1d0.p;
    for (; lVar16 <= local_1ec.bigend.vect[2]; lVar16 = lVar16 + 1) {
      lVar4 = (lVar16 - local_d0.begin.z) * local_d0.kstride;
      local_2e0 = local_308;
      local_2e8 = local_300;
      local_2f0 = local_320;
      for (lVar8 = lVar11; lVar8 <= local_1ec.bigend.vect[1]; lVar8 = lVar8 + 1) {
        if (local_1ec.smallend.vect[0] <= local_1ec.bigend.vect[0]) {
          lVar5 = (lVar8 - local_d0.begin.y) * local_d0.jstride;
          lVar7 = local_2e0;
          lVar18 = local_2e8;
          lVar26 = local_2f0;
          local_328 = lVar23;
          do {
            dVar27 = 2.2250738585072014e-308;
            dVar28 = 1.79769313486232e+308;
            lVar6 = lVar7;
            lVar17 = lVar18;
            lVar25 = lVar26;
            for (lVar20 = lVar1; lVar10 = lVar6, lVar12 = lVar1, lVar19 = lVar17, lVar22 = lVar25,
                lVar20 != 2; lVar20 = lVar20 + 1) {
              for (; lVar24 = lVar1, lVar12 != 2; lVar12 = lVar12 + 1) {
                for (; lVar24 != 2; lVar24 = lVar24 + 1) {
                  dVar29 = dVar27;
                  if (0.0 < *(double *)(lVar10 + lVar24 * 8)) {
                    dVar29 = *(double *)(lVar19 + lVar24 * 8) / *(double *)(lVar22 + lVar24 * 8);
                    dVar2 = dVar29;
                    if (dVar28 <= dVar29) {
                      dVar2 = dVar28;
                    }
                    dVar28 = dVar2;
                    if (dVar29 <= dVar27) {
                      dVar29 = dVar27;
                    }
                  }
                  dVar27 = dVar29;
                }
                lVar10 = lVar10 + lVar3;
                lVar19 = lVar19 + lVar9;
                lVar22 = lVar22 + lVar14;
              }
              lVar25 = lVar25 + lVar15;
              lVar17 = lVar17 + lVar13;
              lVar6 = lVar6 + lVar21;
            }
            dVar29 = local_d0.p[lVar4 + lVar5 + (local_328 - local_d0.begin.x)] /
                     local_150.p
                     [(lVar16 - local_150.begin.z) * local_150.kstride +
                      (lVar8 - local_150.begin.y) * local_150.jstride +
                      (local_328 - local_150.begin.x)];
            if (dVar28 <= dVar29) {
              dVar28 = dVar29;
            }
            if (dVar28 <= dVar27) {
              dVar27 = dVar28;
            }
            local_d0.p[lVar4 + lVar5 + (local_328 - local_d0.begin.x)] =
                 dVar27 * local_150.p
                          [(lVar16 - local_150.begin.z) * local_150.kstride +
                           (lVar8 - local_150.begin.y) * local_150.jstride +
                           (local_328 - local_150.begin.x)];
            local_328 = local_328 + 1;
            lVar26 = lVar26 + 8;
            lVar18 = lVar18 + 8;
            lVar7 = lVar7 + 8;
          } while (local_1ec.bigend.vect[0] + 1 != (int)local_328);
        }
        local_2f0 = local_2f0 + lVar14;
        local_2e8 = local_2e8 + lVar9;
        local_2e0 = local_2e0 + lVar3;
      }
      local_320 = local_320 + lVar15;
      local_300 = local_300 + lVar13;
      local_308 = local_308 + lVar21;
    }
    amrex::MFIter::operator++(&mfi);
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::ConservativeScalMinMax ( amrex::MultiFab&       Snew, const int snew_comp, const int new_density_comp,
                                           amrex::MultiFab const& Sold, const int sold_comp, const int old_density_comp )
{

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const auto& bx = mfi.tilebox();

        const auto& sn   = Snew.array(mfi,snew_comp);
        const auto& so   = Sold.const_array(mfi,sold_comp);
        const auto& rhon = Snew.const_array(mfi,new_density_comp);
        const auto& rhoo = Sold.const_array(mfi,old_density_comp);
#ifdef AMREX_USE_EB
        const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
        const auto& vfrac = ebfactory.getVolFrac().const_array(mfi);
#endif

        amrex::ParallelFor(bx, [=]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real smn = std::numeric_limits<Real>::max();
            Real smx = std::numeric_limits<Real>::min();

#if (AMREX_SPACEDIM==3)
            int ks = -1;
            int ke =  1;
#else
            int ks = 0;
            int ke = 0;
#endif

            for (int kk = ks; kk <= ke; ++kk)
            {
                for (int jj = -1; jj <= 1; ++jj)
                {
                    for (int ii = -1; ii <= 1; ++ii)
                    {
#ifdef AMREX_USE_EB
                        if ( vfrac (i+ii,j+jj,k+kk) > 0. )
#endif
                        {
                            smn =  amrex::min(smn, so(i+ii,j+jj,k+kk)/rhoo(i+ii,j+jj,k+kk));
                            smx =  amrex::max(smx, so(i+ii,j+jj,k+kk)/rhoo(i+ii,j+jj,k+kk));
                        }
                    }
                }
            }
            sn(i,j,k) = amrex::min( amrex::max(sn(i,j,k)/rhon(i,j,k), smn), smx ) * rhon(i,j,k);
        });
    }
}